

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iota_generator.cpp
# Opt level: O2

void __thiscall
IotaGenerator_Increment_Test::~IotaGenerator_Increment_Test(IotaGenerator_Increment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (IotaGenerator, Increment) {
    iota_generator g1 (3);
    iota_generator post = g1++;
    EXPECT_EQ (post, iota_generator (3));
    EXPECT_EQ (g1, iota_generator (4));

    iota_generator pre = ++g1;
    EXPECT_EQ (pre, iota_generator (5));
    EXPECT_EQ (g1, iota_generator (5));
}